

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestInterface.cpp
# Opt level: O3

void RunUtilityTests(void)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  FastVector<unsigned_int,_false,_false> arr;
  FastVector<unsigned_int,_false,_false> local_38;
  uint local_24;
  
  if (Tests::messageVerbose == '\x01') {
    puts("FastVector test 1\r");
  }
  testsCount[3] = testsCount[3] + 1;
  local_38.data = (uint *)0x0;
  local_38.max = 0;
  local_38.count = 0;
  local_24 = 1;
  FastVector<unsigned_int,_false,_false>::grow_and_add(&local_38,0,&local_24);
  iVar4 = 0x400;
  do {
    uVar3 = (ulong)local_38.count;
    if (uVar3 == 0) goto LAB_00177f6e;
    uVar1 = local_38.count - 1;
    if (local_38.count == local_38.max) {
      FastVector<unsigned_int,_false,_false>::grow_and_add
                (&local_38,local_38.count,local_38.data + uVar1);
    }
    else {
      local_38.count = local_38.count + 1;
      local_38.data[uVar3] = local_38.data[uVar1];
    }
    if (local_38.count == 0) goto LAB_00177f8d;
    local_38.data[local_38.count - 1] = local_38.data[local_38.count - 1] + 1;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  uVar3 = 0xffffffffffffffff;
  do {
    uVar2 = uVar3;
    if (uVar2 == 0x3ff) {
      testsPassed[3] = testsPassed[3] + 1;
      bVar5 = true;
      goto LAB_00177e4e;
    }
    if (uVar2 - local_38.count == -1) goto LAB_00177f6e;
    uVar3 = uVar2 + 1;
  } while (uVar2 + 2 == (ulong)local_38.data[uVar2 + 1]);
  bVar5 = 0x3ff < uVar3;
  if (Tests::messageVerbose == '\0') {
    puts("FastVector test 1\r");
  }
  if ((uint)uVar3 < local_38.count) {
    printf("Failed %d != %d\n",(ulong)local_38.data[uVar3],uVar2 + 2 & 0xffffffff);
LAB_00177e4e:
    if (local_38.data != (uint *)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    if (bVar5) {
      if (Tests::messageVerbose == '\x01') {
        puts("FastVector test 2\r");
      }
      testsCount[3] = testsCount[3] + 1;
      local_38.data = (uint *)0x0;
      local_38.max = 0;
      local_38.count = 0;
      local_24 = 1;
      FastVector<unsigned_int,_false,_false>::grow_and_add(&local_38,0,&local_24);
      iVar4 = 0x400;
      do {
        uVar3 = (ulong)local_38.count;
        if (uVar3 == 0) goto LAB_00177f6e;
        uVar1 = local_38.count - 1;
        if (local_38.count == local_38.max) {
          FastVector<unsigned_int,_false,_false>::grow_and_add
                    (&local_38,local_38.count,local_38.data + uVar1);
        }
        else {
          local_38.count = local_38.count + 1;
          local_38.data[uVar3] = local_38.data[uVar1];
        }
        if (local_38.count == 0) {
LAB_00177f8d:
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Array.h"
                        ,0x62,
                        "T &FastVector<unsigned int>::back() [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        local_38.data[local_38.count - 1] = local_38.data[local_38.count - 1] + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      uVar3 = 0;
      do {
        uVar2 = uVar3;
        if (uVar2 == 0x400) {
          testsPassed[3] = testsPassed[3] + 1;
          goto LAB_00177f55;
        }
        if (local_38.count == uVar2) goto LAB_00177f6e;
        uVar3 = uVar2 + 1;
      } while (uVar3 == local_38.data[uVar2]);
      if (Tests::messageVerbose != '\x01') {
        puts("FastVector test 2\r");
      }
      if (local_38.count <= (uint)uVar2) goto LAB_00177f6e;
      printf("Failed %d != %d\n",(ulong)local_38.data[uVar2],uVar3 & 0xffffffff);
LAB_00177f55:
      if (local_38.data != (uint *)0x0) {
        (*(code *)NULLC::dealloc)();
      }
    }
    return;
  }
LAB_00177f6e:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Array.h"
                ,0x7f,
                "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void RunUtilityTests()
{
	{
		if(Tests::messageVerbose)
			printf("FastVector test 1\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 1\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}

	{
		if(Tests::messageVerbose)
			printf("FastVector test 2\r\n");

		testsCount[TEST_TYPE_EXTRA]++;

		FastVector<unsigned> arr;

		arr.push_back(1);

		for(unsigned i = 0; i < 1024; i++)
		{
			arr.push_back(arr[arr.size() - 1]);
			arr.back()++;
		}

		for(unsigned i = 0; i < 1024; i++)
		{
			if(arr[i] != i + 1)
			{
				if(!Tests::messageVerbose)
					printf("FastVector test 2\r\n");

				printf("Failed %d != %d\n", arr[i], i + 1);
				return;
			}
		}

		testsPassed[TEST_TYPE_EXTRA]++;
	}
}